

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column.cpp
# Opt level: O0

void __thiscall column::fromString(column *this,string *str)

{
  bool bVar1;
  int iVar2;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [8];
  string tmp;
  string local_40 [36];
  undefined4 local_1c;
  string *psStack_18;
  int idx;
  string *str_local;
  column *this_local;
  
  psStack_18 = str;
  str_local = (string *)this;
  local_1c = std::__cxx11::string::find((char *)str,0x144e32);
  std::__cxx11::string::substr((ulong)local_40,(ulong)psStack_18);
  std::__cxx11::string::operator=((string *)&this->name,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::substr((ulong)local_60,(ulong)psStack_18);
  bVar1 = std::operator==(local_60,"INT");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->flag,"INT");
    this->element_size = 8;
    this->element_truesize = 8;
  }
  else {
    std::__cxx11::string::substr((ulong)local_90,(ulong)local_60);
    bVar1 = std::operator==(local_90,"CHAR");
    std::__cxx11::string::~string((string *)local_90);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->flag,"CHAR");
      local_1c = std::__cxx11::string::find((char *)local_60,0x1449fa);
      std::__cxx11::string::substr((ulong)local_b0,(ulong)local_60);
      std::__cxx11::string::operator=((string *)local_60,local_b0);
      std::__cxx11::string::~string(local_b0);
      iVar2 = std::__cxx11::stoi((string *)local_60,(size_t *)0x0,10);
      this->element_size = iVar2;
      this->element_truesize = this->element_size + 1;
    }
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void column::fromString(const string &str){
    int idx = str.find(":");
    name = str.substr(0, idx);
    string tmp = str.substr(idx+1);
    if(tmp == "INT"){
        flag = "INT";
        element_size = 8;
        element_truesize = 8;
    }
    else if(tmp.substr(0, 4) == "CHAR"){
        flag = "CHAR";
        idx = tmp.find(")");
        tmp  = tmp.substr(5, idx-5);
        element_size = stoi(tmp);
        element_truesize = element_size + 1;
    }
}